

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::DeclaratorSyntax::setChild(DeclaratorSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  EqualsValueClauseSyntax *pEVar2;
  long in_RSI;
  long in_RDI;
  Token TVar3;
  SyntaxList<slang::syntax::VariableDimensionSyntax> *in_stack_ffffffffffffffb8;
  SyntaxList<slang::syntax::VariableDimensionSyntax> *in_stack_ffffffffffffffc0;
  undefined8 local_20;
  undefined8 local_18;
  
  if (in_RSI == 0) {
    TVar3 = ConstTokenOrSyntax::token((ConstTokenOrSyntax *)in_stack_ffffffffffffffb8);
    local_20 = TVar3._0_8_;
    *(undefined8 *)(in_RDI + 0x18) = local_20;
    local_18 = TVar3.info;
    *(Info **)(in_RDI + 0x20) = local_18;
  }
  else if (in_RSI == 1) {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x20a4ec);
    SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>>(pSVar1);
    SyntaxList<slang::syntax::VariableDimensionSyntax>::operator=
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  else {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x20a511);
    if (pSVar1 == (SyntaxNode *)0x0) {
      pEVar2 = (EqualsValueClauseSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x20a521);
      pEVar2 = SyntaxNode::as<slang::syntax::EqualsValueClauseSyntax>(pSVar1);
    }
    *(EqualsValueClauseSyntax **)(in_RDI + 0x60) = pEVar2;
  }
  return;
}

Assistant:

void DeclaratorSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: name = child.token(); return;
        case 1: dimensions = child.node()->as<SyntaxList<VariableDimensionSyntax>>(); return;
        case 2: initializer = child.node() ? &child.node()->as<EqualsValueClauseSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}